

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exposer.cc
# Opt level: O1

void __thiscall
prometheus::Exposer::RegisterCollectable
          (Exposer *this,weak_ptr<prometheus::Collectable> *collectable,string *uri)

{
  mutex *__mutex;
  int iVar1;
  Endpoint *this_00;
  undefined8 uVar2;
  
  __mutex = &this->mutex_;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    this_00 = GetEndpointForUri(this,uri);
    detail::Endpoint::RegisterCollectable(this_00,collectable);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  uVar2 = std::__throw_system_error(iVar1);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar2);
}

Assistant:

void Exposer::RegisterCollectable(const std::weak_ptr<Collectable>& collectable,
                                  const std::string& uri) {
  std::lock_guard<std::mutex> lock{mutex_};
  auto& endpoint = GetEndpointForUri(uri);
  endpoint.RegisterCollectable(collectable);
}